

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

bool JSON::checkSchemaInternal
               (JSON_value *this_v,JSON_value *sch_v,unsigned_long flags,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors,string *prefix)

{
  vector<JSON,_std::allocator<JSON>_> *this;
  _Rb_tree_node_base *__x;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> _Var1;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> this_v_00;
  undefined8 *puVar2;
  JSON_value *pJVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  reference pvVar11;
  size_type sVar12;
  int __val;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *this_01;
  JSON *element;
  undefined8 *puVar13;
  bool bVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  members;
  string key_1;
  string pattern_key;
  string err_prefix;
  long local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  local_190;
  string local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Rb_tree_node_base *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this_v == (JSON_value *)0x0) {
    lVar4 = 0;
    local_198 = 0;
  }
  else {
    lVar4 = __dynamic_cast(this_v,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    local_198 = __dynamic_cast(this_v,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
  }
  if (sch_v == (JSON_value *)0x0) {
    bVar14 = true;
    lVar6 = 0;
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    lVar6 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
    lVar7 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_string::typeinfo,0);
    bVar14 = lVar7 == 0;
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  if (prefix->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_118);
  }
  else {
    std::operator+(&local_138,"json key \"",prefix);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
                   &local_138,"\"");
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_138);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  if (lVar6 == 0) {
    if (lVar5 == 0) {
      if (bVar14) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_190,&local_118," schema value is not dictionary, array, or string");
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(errors,(value_type *)&local_190);
        goto LAB_0011f881;
      }
    }
    else {
      this = (vector<JSON,_std::allocator<JSON>_> *)(lVar5 + 0x10);
      lVar5 = *(long *)(lVar5 + 0x18) - *(long *)(lVar5 + 0x10);
      if (lVar5 != 0x10) {
        if (lVar4 != 0) {
          puVar13 = *(undefined8 **)(lVar4 + 0x10);
          puVar2 = *(undefined8 **)(lVar4 + 0x18);
          if ((long)puVar2 - (long)puVar13 == lVar5) {
            __n = 0;
            for (; puVar13 != puVar2; puVar13 = puVar13 + 2) {
              pJVar3 = *(JSON_value **)*puVar13;
              pvVar11 = std::vector<JSON,_std::allocator<JSON>_>::at(this,__n);
              _Var1._M_t.
              super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
              super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
                   (((pvVar11->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->value)._M_t.
                   super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
                   _M_t;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_190,prefix,".");
              std::__cxx11::to_string(&local_160,__n);
              std::operator+(&local_b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_190,&local_160);
              checkSchemaInternal(pJVar3,(JSON_value *)
                                         _Var1._M_t.
                                         super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                                         .super__Head_base<0UL,_JSON::JSON_value_*,_false>.
                                         _M_head_impl,flags,errors,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_160);
              std::__cxx11::string::~string((string *)&local_190);
              __n = __n + 1;
            }
            goto LAB_0011fa19;
          }
        }
        std::operator+(&local_160,&local_118," is supposed to be an array of length ");
        std::__cxx11::to_string(&local_f8,lVar5 >> 4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_190,&local_160,&local_f8);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(errors,(value_type *)&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_f8);
        this_01 = &local_160;
        goto LAB_0011f9c2;
      }
      if (lVar4 == 0) {
        pvVar11 = std::vector<JSON,_std::allocator<JSON>_>::at(this,0);
        _Var1._M_t.
        super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
        super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
             (((pvVar11->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             value)._M_t.
             super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
        std::__cxx11::string::string((string *)&local_d0,(string *)prefix);
        checkSchemaInternal(this_v,(JSON_value *)
                                   _Var1._M_t.
                                   super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                                   .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                            flags,errors,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      else {
        puVar2 = *(undefined8 **)(lVar4 + 0x18);
        __val = 0;
        for (puVar13 = *(undefined8 **)(lVar4 + 0x10); puVar13 != puVar2; puVar13 = puVar13 + 2) {
          pJVar3 = *(JSON_value **)*puVar13;
          pvVar11 = std::vector<JSON,_std::allocator<JSON>_>::at(this,0);
          _Var1._M_t.
          super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
          super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
               (((pvVar11->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->value)._M_t.
               super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,prefix,".");
          std::__cxx11::to_string(&local_160,__val);
          std::operator+(&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,&local_160);
          checkSchemaInternal(pJVar3,(JSON_value *)
                                     _Var1._M_t.
                                     super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                                     .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                              flags,errors,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_190);
          __val = __val + 1;
        }
      }
    }
  }
  else {
    if (local_198 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190
                     ,&local_118," is supposed to be a dictionary");
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(errors,(value_type *)&local_190);
LAB_0011f881:
      this_01 = (string *)&local_190;
LAB_0011f9c2:
      std::__cxx11::string::~string((string *)this_01);
      bVar14 = false;
      goto LAB_0011fa24;
    }
    local_140 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 *)(lVar6 + 0x10);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
    ::_Rb_tree(&local_190,local_140);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    if (local_190._M_impl.super__Rb_tree_header._M_node_count == 1) {
      std::__cxx11::string::_M_assign((string *)&local_160);
      if (2 < local_160._M_string_length) {
        pcVar8 = (char *)std::__cxx11::string::at((ulong)&local_160);
        if (*pcVar8 == '<') {
          pcVar8 = (char *)std::__cxx11::string::at((ulong)&local_160);
          if (*pcVar8 == '>') {
            std::__cxx11::string::_M_assign((string *)&local_138);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_160);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
    ::~_Rb_tree(&local_190);
    if (local_138._M_string_length == 0) {
      local_d8 = (_Rb_tree_node_base *)(lVar6 + 0x18);
      for (p_Var10 = *(_Rb_tree_node_base **)(lVar6 + 0x28); p_Var10 != local_d8;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        __x = p_Var10 + 1;
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                          *)(local_198 + 0x10),(key_type *)__x);
        if (sVar12 == 0) {
          if ((flags & 1) == 0) {
            std::operator+(&local_f8,&local_118,": key \"");
            std::operator+(&local_160,&local_f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x)
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_190,&local_160,"\" is present in schema but missing in object");
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(errors,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_190);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_160);
            this_00 = &local_f8;
            goto LAB_0011f78c;
          }
        }
        else {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                                 *)(local_198 + 0x10),(key_type *)__x);
          _Var1._M_t.
          super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
          super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
               (((pmVar9->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               value)._M_t.
               super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
          pJVar3 = (JSON_value *)**(undefined8 **)(p_Var10 + 2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,prefix,".");
          std::operator+(&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
          checkSchemaInternal((JSON_value *)
                              _Var1._M_t.
                              super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                              .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,pJVar3,
                              flags,errors,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
LAB_0011f78c:
          std::__cxx11::string::~string((string *)this_00);
        }
      }
      for (p_Var10 = *(_Rb_tree_node_base **)(local_198 + 0x28);
          p_Var10 != (_Rb_tree_node_base *)(local_198 + 0x18);
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                          *)local_140,(key_type *)(p_Var10 + 1));
        if (sVar12 == 0) {
          std::operator+(&local_f8,&local_118,": key \"");
          std::operator+(&local_160,&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,&local_160,"\" is not present in schema but appears in object");
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(errors,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
    }
    else {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                             *)local_140,&local_138);
      _Var1._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
      super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
           (((pmVar9->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
      for (p_Var10 = *(_Rb_tree_node_base **)(local_198 + 0x28);
          p_Var10 != (_Rb_tree_node_base *)(local_198 + 0x18);
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                               *)(local_198 + 0x10),(key_type *)(p_Var10 + 1));
        this_v_00._M_t.
        super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
        super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
             (((pmVar9->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             value)._M_t.
             super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_190,prefix,".");
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var10 + 1));
        checkSchemaInternal((JSON_value *)
                            this_v_00._M_t.
                            super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                            .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                            (JSON_value *)
                            _Var1._M_t.
                            super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                            .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,flags,
                            errors,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_190);
      }
    }
  }
LAB_0011fa19:
  bVar14 = (errors->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)errors;
LAB_0011fa24:
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  return bVar14;
}

Assistant:

bool
JSON::checkSchemaInternal(
    JSON_value* this_v,
    JSON_value* sch_v,
    unsigned long flags,
    std::list<std::string>& errors,
    std::string prefix)
{
    auto* this_arr = dynamic_cast<JSON_array*>(this_v);
    auto* this_dict = dynamic_cast<JSON_dictionary*>(this_v);

    auto* sch_arr = dynamic_cast<JSON_array*>(sch_v);
    auto* sch_dict = dynamic_cast<JSON_dictionary*>(sch_v);

    auto* sch_str = dynamic_cast<JSON_string*>(sch_v);

    std::string err_prefix;
    if (prefix.empty()) {
        err_prefix = "top-level object";
    } else {
        err_prefix = "json key \"" + prefix + "\"";
    }

    std::string pattern_key;
    if (sch_dict) {
        if (!this_dict) {
            QTC::TC("libtests", "JSON wanted dictionary");
            errors.push_back(err_prefix + " is supposed to be a dictionary");
            return false;
        }
        auto members = sch_dict->members;
        std::string key;
        if ((members.size() == 1) &&
            ((key = members.begin()->first, key.length() > 2) && (key.at(0) == '<') &&
             (key.at(key.length() - 1) == '>'))) {
            pattern_key = key;
        }
    }

    if (sch_dict && (!pattern_key.empty())) {
        auto pattern_schema = sch_dict->members[pattern_key].m->value.get();
        for (auto const& iter: this_dict->members) {
            std::string const& key = iter.first;
            checkSchemaInternal(
                this_dict->members[key].m->value.get(),
                pattern_schema,
                flags,
                errors,
                prefix + "." + key);
        }
    } else if (sch_dict) {
        for (auto& iter: sch_dict->members) {
            std::string const& key = iter.first;
            if (this_dict->members.count(key)) {
                checkSchemaInternal(
                    this_dict->members[key].m->value.get(),
                    iter.second.m->value.get(),
                    flags,
                    errors,
                    prefix + "." + key);
            } else {
                if (flags & f_optional) {
                    QTC::TC("libtests", "JSON optional key");
                } else {
                    QTC::TC("libtests", "JSON key missing in object");
                    errors.push_back(
                        err_prefix + ": key \"" + key +
                        "\" is present in schema but missing in object");
                }
            }
        }
        for (auto const& iter: this_dict->members) {
            std::string const& key = iter.first;
            if (sch_dict->members.count(key) == 0) {
                QTC::TC("libtests", "JSON key extra in object");
                errors.push_back(
                    err_prefix + ": key \"" + key +
                    "\" is not present in schema but appears in object");
            }
        }
    } else if (sch_arr) {
        auto n_elements = sch_arr->elements.size();
        if (n_elements == 1) {
            // A single-element array in the schema allows a single element in the object or a
            // variable-length array, each of whose items must conform to the single element of the
            // schema array. This doesn't apply to arrays of arrays -- we fall back to the behavior
            // of allowing a single item only when the object is not an array.
            if (this_arr) {
                int i = 0;
                for (auto const& element: this_arr->elements) {
                    checkSchemaInternal(
                        element.m->value.get(),
                        sch_arr->elements.at(0).m->value.get(),
                        flags,
                        errors,
                        prefix + "." + std::to_string(i));
                    ++i;
                }
            } else {
                QTC::TC("libtests", "JSON schema array for single item");
                checkSchemaInternal(
                    this_v, sch_arr->elements.at(0).m->value.get(), flags, errors, prefix);
            }
        } else if (!this_arr || (this_arr->elements.size() != n_elements)) {
            QTC::TC("libtests", "JSON schema array length mismatch");
            errors.push_back(
                err_prefix + " is supposed to be an array of length " + std::to_string(n_elements));
            return false;
        } else {
            // A multi-element array in the schema must correspond to an element of the same length
            // in the object. Each element in the object is validated against the corresponding
            // element in the schema.
            size_t i = 0;
            for (auto const& element: this_arr->elements) {
                checkSchemaInternal(
                    element.m->value.get(),
                    sch_arr->elements.at(i).m->value.get(),
                    flags,
                    errors,
                    prefix + "." + std::to_string(i));
                ++i;
            }
        }
    } else if (!sch_str) {
        QTC::TC("libtests", "JSON schema other type");
        errors.push_back(err_prefix + " schema value is not dictionary, array, or string");
        return false;
    }

    return errors.empty();
}